

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

void __thiscall
BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
::BPlusTree(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
            *this,BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                  *other)

{
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  **ppBVar1;
  
  this->data_size = 0;
  this->subset_size = 0;
  b_array::
  Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::Array(&this->data,3);
  (this->subset).data =
       (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
        **)0x0;
  (this->subset).capacity = 4;
  ppBVar1 = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
             **)operator_new__(0x20);
  ppBVar1[2] = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
  ppBVar1[3] = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
  *ppBVar1 = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
              *)0x0;
  ppBVar1[1] = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
  (this->subset).data = ppBVar1;
  this->next = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
  copy_tree(this,other);
  link_leaves(this,(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                    *)0x0);
  return;
}

Assistant:

BPlusTree<T>::BPlusTree(const BPlusTree<T>& other) {
    copy_tree(other);
    link_leaves();
}